

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall FlowGraph::Destroy(FlowGraph *this)

{
  undefined1 *puVar1;
  IRKind IVar2;
  char cVar3;
  byte bVar4;
  OpCode OVar5;
  ushort uVar6;
  YieldOffsetResumeLabelList *pYVar7;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar8;
  Loop *pLVar9;
  LabelInstr *pLVar10;
  List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *list;
  Opnd *pOVar11;
  BasicBlock *pBVar12;
  Opnd *pOVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  code *pcVar18;
  bool bVar19;
  ExecutionMode EVar20;
  BOOL BVar21;
  undefined4 *puVar22;
  JITTimeFunctionBody *this_00;
  LabelInstr **ppLVar23;
  Type *ppBVar24;
  BasicBlock *pBVar25;
  Type *ppFVar26;
  BasicBlock *pBVar27;
  Instr *pIVar28;
  Func **ppFVar29;
  char *pcVar30;
  Func **ppFVar31;
  char *pcVar32;
  Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer> *this_01;
  uint uVar33;
  long lVar34;
  long lVar35;
  Type pBVar36;
  undefined1 local_70 [8];
  Iterator __iter;
  SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *local_58;
  BasicBlock *intermediateBlock;
  LabelInstr *local_38;
  BranchInstr *branchInstr;
  
  BVar21 = Func::HasTry(this->func);
  if (BVar21 != 0) {
    RemoveUnreachableBlocks(this);
  }
  pBVar25 = this->blockList;
  if (pBVar25 != (BasicBlock *)0x0) {
    puVar22 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      local_38 = (LabelInstr *)pBVar25->firstInstr;
      if ((*(ushort *)&pBVar25->field_0x18 & 3) == 1) {
        IVar2 = (local_38->super_Instr).m_kind;
        if (((IVar2 == InstrKindProfiledLabel) || (IVar2 == InstrKindLabel)) &&
           (local_38->m_block = (BasicBlock *)0x0, BVar21 == 0)) {
          this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
          bVar19 = JITTimeFunctionBody::IsCoroutine(this_00);
          if ((bVar19) &&
             (pYVar7 = this->func->m_yieldOffsetResumeLabelList,
             0 < (pYVar7->
                 super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                 ).count)) {
            lVar34 = 0;
            lVar35 = 0;
            do {
              this_01 = (Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer> *)
                        ((long)&((pYVar7->
                                 super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                                 ).buffer)->first + lVar34);
              ppLVar23 = JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>::Second
                                   (this_01);
              if (local_38 == *ppLVar23) {
                local_38->field_0x78 = local_38->field_0x78 & 0xfb;
                list = this->func->m_yieldOffsetResumeLabelList;
                Js::
                CopyRemovePolicy<JsUtil::List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
                ::Remove(&list->removePolicy,list,this_01);
                break;
              }
              lVar35 = lVar35 + 1;
              lVar34 = lVar34 + 0x18;
            } while (lVar35 < (pYVar7->
                              super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                              ).count);
          }
          if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
               (local_38->labelRefs).
               super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListNodeBase<Memory::ArenaAllocator>.next != &local_38->labelRefs) ||
             ((local_38->field_0x78 & 4) != 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar22 = 1;
            bVar19 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x690,"(labelInstr->IsUnreferenced())",
                                "labelInstr->IsUnreferenced()");
            if (!bVar19) goto LAB_00417f38;
            *puVar22 = 0;
          }
LAB_004174b4:
          IR::Instr::Remove(&local_38->super_Instr);
        }
      }
      else {
        if ((*(ushort *)&pBVar25->field_0x18 & 6) == 4) {
          IVar2 = (local_38->super_Instr).m_kind;
          if (((IVar2 != InstrKindProfiledLabel) && (IVar2 != InstrKindLabel)) ||
             ((local_38->field_0x78 & 1) == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar22 = 1;
            bVar19 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                ,0x69e,
                                "(firstInstr->IsLabelInstr() && firstInstr->AsLabelInstr()->m_isLoopTop)"
                                ,"Label not marked as loop top...");
            if (!bVar19) goto LAB_00417f38;
            *puVar22 = 0;
          }
          __iter.current = (NodeBase *)&pBVar25->loop->blockList;
          pBVar36 = (Type)0x0;
          local_58 = (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)__iter.current;
LAB_00417093:
          if (local_58 == (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar22 = 1;
            bVar19 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar19) goto LAB_00417f38;
            *puVar22 = 0;
          }
          local_58 = (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                     (local_58->super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>).
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
          if (local_58 != (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)__iter.current)
          {
            ppBVar24 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                 ((Iterator *)&__iter.current);
            if (((*ppBVar24)->field_0x18 & 1) == 0) {
              local_70 = (undefined1  [8])&(*ppBVar24)->succList;
              __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_70;
              do {
                if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0)
                {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar22 = 1;
                  bVar19 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
                  if (!bVar19) goto LAB_00417f38;
                  *puVar22 = 0;
                }
                pSVar8 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                         ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
                if ((undefined1  [8])pSVar8 == local_70) goto LAB_00417093;
                __iter.list = pSVar8;
                ppFVar26 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                     ((Iterator *)local_70);
                pBVar12 = (*ppFVar26)->succBlock;
                if (pBVar12 == (BasicBlock *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar22 = 1;
                  bVar19 = Js::Throw::ReportAssert
                                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                      ,0x6a1,"(succ)","succ");
                  if (!bVar19) goto LAB_00417f38;
                  *puVar22 = 0;
                }
              } while (pBVar12 != pBVar25);
              pBVar36 = *ppBVar24;
            }
            goto LAB_00417093;
          }
          if (pBVar36 == (Type)0x0) {
            IVar2 = (local_38->super_Instr).m_kind;
            if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar22 = 1;
              bVar19 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                  ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
              if (!bVar19) goto LAB_00417f38;
              *puVar22 = 0;
            }
            local_38->field_0x78 = local_38->field_0x78 & 0xfe;
          }
          else {
            pBVar12 = pBVar36->next;
            ppFVar29 = (Func **)&pBVar12->firstInstr;
            if (pBVar12 == (BasicBlock *)0x0) {
              ppFVar29 = &pBVar36->func;
            }
            lVar34 = 0x18;
            if (pBVar12 == (BasicBlock *)0x0) {
              lVar34 = 0xd0;
            }
            if (*(char *)(*(long *)((long)&(*ppFVar29)->m_alloc + lVar34) + 0x39) != '\x02') {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar22 = 1;
              bVar19 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                  ,0x6ad,"(loopTail->GetLastInstr()->IsBranchInstr())",
                                  "LastInstr of loop should always be a branch no?");
              if (!bVar19) goto LAB_00417f38;
              *puVar22 = 0;
            }
            pLVar9 = pBVar25->loop;
            pLVar10 = (LabelInstr *)pBVar25->firstInstr;
            IVar2 = (pLVar10->super_Instr).m_kind;
            if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar22 = 1;
              bVar19 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                  ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
              if (!bVar19) goto LAB_00417f38;
              *puVar22 = 0;
            }
            pLVar9->loopTopLabel = pLVar10;
          }
        }
        if (BVar21 != 0) {
          UpdateRegionForBlock(this,pBVar25);
        }
        IVar2 = (local_38->super_Instr).m_kind;
        if ((IVar2 == InstrKindProfiledLabel) || (IVar2 == InstrKindLabel)) {
          local_38->m_block = (BasicBlock *)0x0;
          if ((BVar21 == 0) &&
             (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
               (local_38->labelRefs).
               super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListNodeBase<Memory::ArenaAllocator>.next == &local_38->labelRefs &&
              ((local_38->field_0x78 & 4) == 0)))) {
            pBVar12 = pBVar25->next;
            ppFVar29 = (Func **)&pBVar12->firstInstr;
            if (pBVar12 == (BasicBlock *)0x0) {
              ppFVar29 = &pBVar25->func;
            }
            lVar34 = 0x18;
            if (pBVar12 == (BasicBlock *)0x0) {
              lVar34 = 0xd0;
            }
            pLVar10 = *(LabelInstr **)((long)&(*ppFVar29)->m_alloc + lVar34);
            IR::Instr::Remove((Instr *)local_38);
            if (local_38 == pLVar10) goto LAB_004174bd;
          }
        }
        pBVar12 = pBVar25->next;
        ppFVar29 = (Func **)&pBVar12->firstInstr;
        if (pBVar12 == (BasicBlock *)0x0) {
          ppFVar29 = &pBVar25->func;
        }
        lVar34 = 0x18;
        if (pBVar12 == (BasicBlock *)0x0) {
          lVar34 = 0xd0;
        }
        local_38 = *(LabelInstr **)((long)&(*ppFVar29)->m_alloc + lVar34);
        if ((local_38->super_Instr).m_kind == InstrKindBranch) {
          OVar5 = (local_38->super_Instr).m_opcode;
          if (OVar5 < ADD) {
            if ((OVar5 == MultiBr) || (OVar5 == Br)) goto LAB_00417421;
          }
          else {
            bVar19 = LowererMD::IsUnconditionalBranch(&local_38->super_Instr);
            if (bVar19) {
LAB_00417421:
              if ((Instr *)(local_38->labelRefs).
                           super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
                           allocator == (local_38->super_Instr).m_next) goto LAB_004174b4;
            }
          }
        }
      }
LAB_004174bd:
      pBVar25 = pBVar25->next;
    } while (pBVar25 != (BasicBlock *)0x0);
  }
  if ((BVar21 != 0) && (pBVar25 = this->blockList, pBVar25 != (BasicBlock *)0x0)) {
    puVar22 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
LAB_004174fd:
    if ((pBVar25->field_0x18 & 1) != 0) goto LAB_00417ed6;
    pIVar28 = pBVar25->firstInstr;
    IVar2 = pIVar28->m_kind;
    if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar22 = 1;
      bVar19 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                          ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar19) {
LAB_00417f38:
        pcVar18 = (code *)invalidInstructionException();
        (*pcVar18)();
      }
      *puVar22 = 0;
    }
    pOVar11 = pIVar28[1].m_src2;
    __iter.current = (NodeBase *)&pBVar25->predList;
    local_58 = (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)__iter.current;
LAB_00417582:
    if (local_58 == (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar22 = 1;
      bVar19 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                          ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar19) goto LAB_00417f38;
      *puVar22 = 0;
    }
    local_58 = (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
               (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                &local_58->super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>)->
               super_SListNodeBase<Memory::ArenaAllocator>).next;
    if (local_58 == (SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)__iter.current)
    goto LAB_00417d1f;
    ppFVar26 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)&__iter.current);
    pBVar12 = (*ppFVar26)->predBlock;
    if (pBVar12 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar22 = 1;
      bVar19 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                          ,0x6e7,"(predBlock)","predBlock");
      if (!bVar19) goto LAB_00417f38;
      *puVar22 = 0;
    }
    pIVar28 = pBVar12->firstInstr;
    IVar2 = pIVar28->m_kind;
    if ((IVar2 != InstrKindLabel) && (IVar2 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar22 = 1;
      bVar19 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                          ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar19) goto LAB_00417f38;
      *puVar22 = 0;
    }
    pBVar27 = pBVar12->next;
    ppFVar29 = &pBVar12->func;
    ppFVar31 = (Func **)&pBVar27->firstInstr;
    if (pBVar27 == (BasicBlock *)0x0) {
      ppFVar31 = ppFVar29;
    }
    lVar34 = 0x18;
    if (pBVar27 == (BasicBlock *)0x0) {
      lVar34 = 0xd0;
    }
    pOVar13 = pIVar28[1].m_src2;
    lVar34 = *(long *)((long)&(*ppFVar31)->m_alloc + lVar34);
    if (lVar34 == 0) goto LAB_00417760;
    uVar6 = *(ushort *)(lVar34 + 0x30);
    if (uVar6 < 0xeb) {
      if (uVar6 - 0xe7 < 2) {
        if (*(Opnd **)&pOVar11->m_valueType != pOVar13) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar22 = 1;
          bVar19 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                              ,0x6f5,"(region->GetParent() == predRegion)",
                              "Bad region prop on entry to try-catch/finally");
          if (!bVar19) goto LAB_00417f38;
          *puVar22 = 0;
          pBVar27 = pBVar12->next;
        }
        ppFVar31 = (Func **)&pBVar27->firstInstr;
        if (pBVar27 == (BasicBlock *)0x0) {
          ppFVar31 = ppFVar29;
        }
        pIVar28 = pBVar25->firstInstr;
        lVar34 = 0x18;
        if (pBVar27 == (BasicBlock *)0x0) {
          lVar34 = 0xd0;
        }
        lVar34 = *(long *)((long)&(*ppFVar31)->m_alloc + lVar34);
        if (*(char *)(lVar34 + 0x39) != '\x02') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar22 = 1;
          bVar19 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                              ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
          if (!bVar19) goto LAB_00417f38;
          *puVar22 = 0;
        }
        if (pIVar28 == *(Instr **)(lVar34 + 0x68)) {
          pBVar12 = pBVar12->next;
          ppFVar31 = (Func **)&pBVar12->firstInstr;
          if (pBVar12 == (BasicBlock *)0x0) {
            ppFVar31 = ppFVar29;
          }
          lVar34 = 0x18;
          if (pBVar12 == (BasicBlock *)0x0) {
            lVar34 = 0xd0;
          }
          if (*(short *)(*(long *)((long)&(*ppFVar31)->m_alloc + lVar34) + 0x30) == 0xe7) {
            if (*(char *)&pOVar11->_vptr_Opnd == '\x03') goto LAB_00417582;
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar22 = 1;
            uVar33 = 0x6fa;
            pcVar32 = "(region->GetType() == RegionTypeCatch)";
            pcVar30 = "Bad region type on entry to catch";
          }
          else {
            if (*(char *)&pOVar11->_vptr_Opnd == '\x04') goto LAB_00417582;
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar22 = 1;
            uVar33 = 0x6fe;
            pcVar32 = "(region->GetType() == RegionTypeFinally)";
            pcVar30 = "Bad region type on entry to finally";
          }
        }
        else {
          if (*(char *)&pOVar11->_vptr_Opnd == '\x02') goto LAB_00417582;
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar22 = 1;
          uVar33 = 0x703;
          pcVar32 = "(region->GetType() == RegionTypeTry)";
          pcVar30 = "Bad region type on entry to try";
        }
      }
      else {
        if (uVar6 != 9) {
          if (((uVar6 == 0xea) && (pOVar11 != *(Opnd **)&pOVar13->m_valueType)) &&
             ((pOVar11 != pOVar13 || (bVar19 = Func::IsLoopBodyInTry(this->func), !bVar19)))) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar22 = 1;
            uVar33 = 0x70d;
            pcVar32 = 
            "(region == predRegion->GetParent() || (region == predRegion && this->func->IsLoopBodyInTry()))"
            ;
            goto LAB_00417a46;
          }
          goto LAB_00417582;
        }
        if (*(char *)(lVar34 + 0x39) != '\x02') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar22 = 1;
          bVar19 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                              ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
          if (!bVar19) goto LAB_00417f38;
          *puVar22 = 0;
        }
        if (*(char *)(lVar34 + 0x5b) == '\x01') {
          if (pOVar11 != *(Opnd **)&pOVar13->m_valueType) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar22 = 1;
            uVar33 = 0x724;
            pcVar32 = "(region == predRegion->GetParent())";
            pcVar30 = "Bad region prop in finally";
            goto LAB_00417cfb;
          }
          goto LAB_00417582;
        }
        if (pOVar11 == pOVar13 || *(char *)&pOVar11->_vptr_Opnd != '\x03') {
          cVar3 = *(char *)&pOVar13->_vptr_Opnd;
          if (*(char *)&pOVar11->_vptr_Opnd != '\x04' || pOVar11 == pOVar13) {
            if (cVar3 == '\x04') {
              bVar19 = (Opnd *)pOVar13[1]._vptr_Opnd[5] == pOVar13;
            }
            else {
              bVar19 = false;
            }
            if ((pOVar11 != pOVar13) && (!bVar19)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar22 = 1;
              uVar33 = 0x732;
              pcVar32 = "(predRegion->IsNonExceptingFinally() || region == predRegion)";
              pcVar30 = "Bad region propagation through interior block";
              goto LAB_00417cfb;
            }
            goto LAB_00417582;
          }
          if ((cVar3 == '\x02') ||
             ((cVar3 == '\x04' && ((Opnd *)pOVar13[1]._vptr_Opnd[5] == pOVar13))))
          goto LAB_00417582;
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar22 = 1;
          uVar33 = 0x72d;
          pcVar32 = 
          "(predRegion->IsNonExceptingFinally() || predRegion->GetType() == RegionTypeTry)";
        }
        else {
          if (*(char *)&pOVar13->_vptr_Opnd == '\x02') goto LAB_00417582;
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar22 = 1;
          uVar33 = 0x728;
          pcVar32 = "(predRegion->GetType() == RegionTypeTry)";
        }
        pcVar30 = "Bad region type for the try";
      }
    }
    else if (uVar6 == 0xeb) {
      if ((pOVar11 == *(Opnd **)&pOVar13->m_valueType) ||
         ((*(char *)&pOVar13->_vptr_Opnd == '\x02' && (*(Opnd **)&pOVar13[2].m_valueType == pOVar11)
          ))) goto LAB_00417582;
      if (pOVar11 == pOVar13) {
        bVar19 = Func::IsLoopBodyInTry(this->func);
        if (bVar19) goto LAB_00417582;
        pBVar27 = pBVar12->next;
      }
      ppFVar31 = (Func **)&pBVar27->firstInstr;
      if (pBVar27 == (BasicBlock *)0x0) {
        ppFVar31 = ppFVar29;
      }
      lVar34 = 0x18;
      if (pBVar27 == (BasicBlock *)0x0) {
        lVar34 = 0xd0;
      }
      pIVar28 = IR::Instr::GetPrevRealInstr(*(Instr **)((long)&(*ppFVar31)->m_alloc + lVar34));
      if (((pIVar28->m_opcode == BailOnEarlyExit) && (*(char *)&pOVar11->_vptr_Opnd == '\x04')) &&
         (EVar20 = JITTimeWorkItem::GetJitMode(this->func->m_workItem), EVar20 == SimpleJit))
      goto LAB_00417582;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar22 = 1;
      uVar33 = 0x70a;
      pcVar32 = 
      "(region == predRegion->GetParent() || (predRegion->GetType() == RegionTypeTry && predRegion->GetMatchingFinallyRegion(false) == region) || (region == predRegion && this->func->IsLoopBodyInTry() || (predBlock->GetLastInstr()->GetPrevRealInstr()->m_opcode == Js::OpCode::BailOnEarlyExit && region->GetType() == RegionTypeFinally && this->func->IsSimpleJit())))"
      ;
LAB_00417a46:
      pcVar30 = "Bad region prop on leaving try-catch/finally";
    }
    else if (uVar6 == 0x19e) {
      bVar19 = Func::DoGlobOpt(this->func);
      if (!bVar19) goto LAB_00417582;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar22 = 1;
      uVar33 = 0x716;
      pcVar32 = "(!this->func->DoGlobOpt())";
      pcVar30 = "!this->func->DoGlobOpt()";
    }
    else {
      if ((uVar6 != 0x19f) || ((byte)(*(char *)&pOVar11->_vptr_Opnd - 2U) < 3)) goto LAB_00417582;
      if (*(char *)&pOVar13->_vptr_Opnd == '\x04') {
        if (*(char *)(lVar34 + 0x39) != '\x02') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar22 = 1;
          bVar19 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                              ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
          if (!bVar19) goto LAB_00417f38;
          *puVar22 = 0;
        }
        if ((*(byte *)(lVar34 + 0x58) & 0x10) != 0) goto LAB_00417582;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar22 = 1;
      uVar33 = 0x71e;
      pcVar32 = 
      "(region->GetType() == RegionTypeTry || region->GetType() == RegionTypeCatch || region->GetType() == RegionTypeFinally || (predRegion->GetType() == RegionTypeFinally && predBlock->GetLastInstr()->AsBranchInstr()->m_brFinallyToEarlyExit))"
      ;
      pcVar30 = 
      "region->GetType() == RegionTypeTry || region->GetType() == RegionTypeCatch || region->GetType() == RegionTypeFinally || (predRegion->GetType() == RegionTypeFinally && predBlock->GetLastInstr()->AsBranchInstr()->m_brFinallyToEarlyExit)"
      ;
    }
    goto LAB_00417cfb;
  }
LAB_00417f1b:
  puVar1 = &this->func->field_0x240;
  *(uint *)puVar1 = *(uint *)puVar1 & 0xfffbffff;
  return;
LAB_00417d1f:
  bVar4 = *(byte *)&pOVar11->_vptr_Opnd;
  if (bVar4 - 3 < 2) {
    if (pOVar11[1]._vptr_Opnd != (_func_int **)0x0) goto LAB_00417ed6;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar22 = 1;
    uVar33 = 0x74f;
    pcVar32 = "(region->GetMatchingTryRegion())";
    pcVar30 = "region->GetMatchingTryRegion()";
  }
  else if (bVar4 == 2) {
    bVar19 = Func::DoOptimizeTry(this->func);
    if ((bVar19) ||
       ((EVar20 = JITTimeWorkItem::GetJitMode(this->func->m_workItem), EVar20 == SimpleJit &&
        ((this->func->field_0x240 & 0x10) != 0)))) {
      lVar16._0_2_ = pOVar11[1].m_valueType;
      lVar16._2_1_ = pOVar11[1].m_type;
      lVar16._3_1_ = pOVar11[1].field_0xb;
      lVar16._4_1_ = pOVar11[1].m_kind;
      lVar16._5_1_ = pOVar11[1].isDeleted;
      lVar16._6_2_ = *(undefined2 *)&pOVar11[1].field_0xe;
      if (pOVar11[2]._vptr_Opnd == (_func_int **)0x0) {
        bVar19 = false;
      }
      else {
        lVar17._0_2_ = pOVar11[2].m_valueType;
        lVar17._2_1_ = pOVar11[2].m_type;
        lVar17._3_1_ = pOVar11[2].field_0xb;
        lVar17._4_1_ = pOVar11[2].m_kind;
        lVar17._5_1_ = pOVar11[2].isDeleted;
        lVar17._6_2_ = *(undefined2 *)&pOVar11[2].field_0xe;
        bVar19 = lVar17 != 0;
      }
      if (bVar19 != (lVar16 != 0)) goto LAB_00417ed6;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar22 = 1;
      uVar33 = 0x745;
      pcVar32 = 
      "((region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && region->GetMatchingFinallyRegion(false)))"
      ;
      pcVar30 = 
      "(region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && region->GetMatchingFinallyRegion(false))"
      ;
    }
    else {
      lVar34._0_2_ = pOVar11[1].m_valueType;
      lVar34._2_1_ = pOVar11[1].m_type;
      lVar34._3_1_ = pOVar11[1].field_0xb;
      lVar34._4_1_ = pOVar11[1].m_kind;
      lVar34._5_1_ = pOVar11[1].isDeleted;
      lVar34._6_2_ = *(undefined2 *)&pOVar11[1].field_0xe;
      if (pOVar11[2]._vptr_Opnd == (_func_int **)0x0) {
        bVar19 = false;
      }
      else {
        lVar35._0_2_ = pOVar11[2].m_valueType;
        lVar35._2_1_ = pOVar11[2].m_type;
        lVar35._3_1_ = pOVar11[2].field_0xb;
        lVar35._4_1_ = pOVar11[2].m_kind;
        lVar35._5_1_ = pOVar11[2].isDeleted;
        lVar35._6_2_ = *(undefined2 *)&pOVar11[2].field_0xe;
        bVar19 = lVar35 == 0;
      }
      if (bVar19 != (lVar34 != 0)) goto LAB_00417ed6;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar22 = 1;
      uVar33 = 0x749;
      pcVar32 = 
      "((region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false)))"
      ;
      pcVar30 = 
      "(region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false))"
      ;
    }
  }
  else {
    if ((bVar4 != 1) ||
       ((((pOVar11[1]._vptr_Opnd == (_func_int **)0x0 &&
          (lVar14._0_2_ = pOVar11[1].m_valueType, lVar14._2_1_ = pOVar11[1].m_type,
          lVar14._3_1_ = pOVar11[1].field_0xb, lVar14._4_1_ = pOVar11[1].m_kind,
          lVar14._5_1_ = pOVar11[1].isDeleted, lVar14._6_2_ = *(undefined2 *)&pOVar11[1].field_0xe,
          lVar14 == 0)) && (pOVar11[2]._vptr_Opnd == (_func_int **)0x0)) &&
        (lVar15._0_2_ = pOVar11[2].m_valueType, lVar15._2_1_ = pOVar11[2].m_type,
        lVar15._3_1_ = pOVar11[2].field_0xb, lVar15._4_1_ = pOVar11[2].m_kind,
        lVar15._5_1_ = pOVar11[2].isDeleted, lVar15._6_2_ = *(undefined2 *)&pOVar11[2].field_0xe,
        lVar15 == 0)))) goto LAB_00417ed6;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar22 = 1;
    uVar33 = 0x73f;
    pcVar32 = 
    "(!region->GetMatchingTryRegion() && !region->GetMatchingCatchRegion() && !region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false))"
    ;
    pcVar30 = 
    "!region->GetMatchingTryRegion() && !region->GetMatchingCatchRegion() && !region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false)"
    ;
  }
  bVar19 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                      ,uVar33,pcVar32,pcVar30);
  if (!bVar19) goto LAB_00417f38;
  *puVar22 = 0;
LAB_00417ed6:
  pBVar25 = pBVar25->next;
  if (pBVar25 == (BasicBlock *)0x0) goto code_r0x00417ee2;
  goto LAB_004174fd;
LAB_00417760:
  if (pOVar11 == pOVar13) goto LAB_00417582;
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar22 = 1;
  uVar33 = 0x6ed;
  pcVar32 = "(region == predRegion)";
  pcVar30 = "Bad region propagation through empty block";
LAB_00417cfb:
  bVar19 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                      ,uVar33,pcVar32,pcVar30);
  if (!bVar19) goto LAB_00417f38;
  *puVar22 = 0;
  goto LAB_00417582;
code_r0x00417ee2:
  for (pBVar25 = this->blockList; pBVar25 != (BasicBlock *)0x0; pBVar25 = pBVar25->next) {
    pIVar28 = pBVar25->firstInstr;
    if ((((pIVar28->m_kind == InstrKindProfiledLabel) || (pIVar28->m_kind == InstrKindLabel)) &&
        ((Instr *)pIVar28[1]._vptr_Instr == pIVar28 + 1)) && (((ulong)pIVar28[1].m_func & 4) == 0))
    {
      IR::Instr::Remove(pIVar28);
    }
  }
  goto LAB_00417f1b;
}

Assistant:

void
FlowGraph::Destroy(void)
{
    BOOL fHasTry = this->func->HasTry();
    if (fHasTry)
    {
        // Do unreachable code removal up front to avoid problems
        // with unreachable back edges, etc.
        this->RemoveUnreachableBlocks();
    }

    FOREACH_BLOCK_ALL(block, this)
    {
        IR::Instr * firstInstr = block->GetFirstInstr();
        if (block->isDeleted && !block->isDead)
        {
            if (firstInstr->IsLabelInstr())
            {
                IR::LabelInstr * labelInstr = firstInstr->AsLabelInstr();
                labelInstr->UnlinkBasicBlock();
                // Removing the label for non try blocks as we have a deleted block which has the label instruction
                // still not removed; this prevents the assert for cases where the deleted blocks fall through to a helper block,
                // i.e. helper introduced by polymorphic inlining bailout.
                // Skipping Try blocks as we have dependency on blocks to get the last instr(see below in this function)
                if (!fHasTry)
                {
                    if (this->func->GetJITFunctionBody()->IsCoroutine())
                    {
                        // the label could be a yield resume label, in which case we also need to remove it from the YieldOffsetResumeLabels list
                        this->func->MapUntilYieldOffsetResumeLabels([this, &labelInstr](int i, const YieldOffsetResumeLabel& yorl)
                        {
                            if (labelInstr == yorl.Second())
                            {
                                labelInstr->m_hasNonBranchRef = false;
                                this->func->RemoveYieldOffsetResumeLabel(yorl);
                                return true;
                            }
                            return false;
                        });
                    }

                    Assert(labelInstr->IsUnreferenced());
                    labelInstr->Remove();
                }
            }
            continue;
        }

        if (block->isLoopHeader && !block->isDead)
        {
            // Mark the tail block of this loop (the last back-edge).  The register allocator
            // uses this to lexically find loops.
            BasicBlock *loopTail = nullptr;

            AssertMsg(firstInstr->IsLabelInstr() && firstInstr->AsLabelInstr()->m_isLoopTop,
                "Label not marked as loop top...");
            FOREACH_BLOCK_IN_LOOP(loopBlock, block->loop)
            {
                FOREACH_SUCCESSOR_BLOCK(succ, loopBlock)
                {
                    if (succ == block)
                    {
                        loopTail = loopBlock;
                        break;
                    }
                } NEXT_SUCCESSOR_BLOCK;
            } NEXT_BLOCK_IN_LOOP;

            if (loopTail)
            {
                AssertMsg(loopTail->GetLastInstr()->IsBranchInstr(), "LastInstr of loop should always be a branch no?");
                block->loop->SetLoopTopInstr(block->GetFirstInstr()->AsLabelInstr());
            }
            else
            {
                // This loop doesn't have a back-edge: that is, it is not a loop
                // anymore...
                firstInstr->AsLabelInstr()->m_isLoopTop = FALSE;
            }
        }

        if (fHasTry)
        {
            this->UpdateRegionForBlock(block);
        }

        if (firstInstr->IsLabelInstr())
        {
            IR::LabelInstr * labelInstr = firstInstr->AsLabelInstr();
            labelInstr->UnlinkBasicBlock();
            if (labelInstr->IsUnreferenced() && !fHasTry)
            {
                // This is an unreferenced label, probably added by FG building.
                // Delete it now to make extended basic blocks visible.
                if (firstInstr == block->GetLastInstr())
                {
                    labelInstr->Remove();
                    continue;
                }
                else
                {
                    labelInstr->Remove();
                }
            }
        }

        IR::Instr * lastInstr = block->GetLastInstr();
        if (lastInstr->IsBranchInstr())
        {
            IR::BranchInstr * branchInstr = lastInstr->AsBranchInstr();
            if (!branchInstr->IsConditional() && branchInstr->GetTarget() == branchInstr->m_next)
            {
                // Remove branch to next
                branchInstr->Remove();
            }
        }
    }
    NEXT_BLOCK;

#if DBG

    if (fHasTry)
    {
        // Now that all blocks have regions, we should see consistently propagated regions at all
        // block boundaries.
        FOREACH_BLOCK(block, this)
        {
            Region * region = block->GetFirstInstr()->AsLabelInstr()->GetRegion();
            FOREACH_PREDECESSOR_BLOCK(predBlock, block)
            {
                BasicBlock* intermediateBlock = block;
                Region * predRegion = predBlock->GetFirstInstr()->AsLabelInstr()->GetRegion();
                if (predBlock->GetLastInstr() == nullptr)
                {
                    AssertMsg(region == predRegion, "Bad region propagation through empty block");
                }
                else
                {
                    switch (predBlock->GetLastInstr()->m_opcode)
                    {
                    case Js::OpCode::TryCatch:
                    case Js::OpCode::TryFinally:
                        AssertMsg(region->GetParent() == predRegion, "Bad region prop on entry to try-catch/finally");
                        if (intermediateBlock->GetFirstInstr() == predBlock->GetLastInstr()->AsBranchInstr()->GetTarget())
                        {
                            if (predBlock->GetLastInstr()->m_opcode == Js::OpCode::TryCatch)
                            {
                                AssertMsg(region->GetType() == RegionTypeCatch, "Bad region type on entry to catch");
                            }
                            else
                            {
                                AssertMsg(region->GetType() == RegionTypeFinally, "Bad region type on entry to finally");
                            }
                        }
                        else
                        {
                            AssertMsg(region->GetType() == RegionTypeTry, "Bad region type on entry to try");
                        }
                        break;
                    case Js::OpCode::Leave:
                        AssertMsg(region == predRegion->GetParent() || (predRegion->GetType() == RegionTypeTry && predRegion->GetMatchingFinallyRegion(false) == region) ||
                            (region == predRegion && this->func->IsLoopBodyInTry() ||
                            // edge from early exit to finally in simplejit - in fulljit this Leave would have been deadcoded due to preceeding BailOutOnEarlyExit
                            (predBlock->GetLastInstr()->GetPrevRealInstr()->m_opcode == Js::OpCode::BailOnEarlyExit && region->GetType() == RegionTypeFinally && this->func->IsSimpleJit())), "Bad region prop on leaving try-catch/finally");
                        break;
                    case Js::OpCode::LeaveNull:
                        AssertMsg(region == predRegion->GetParent() || (region == predRegion && this->func->IsLoopBodyInTry()), "Bad region prop on leaving try-catch/finally");
                        break;

                    // If the try region has a branch out of the loop,
                    // - the branch is moved out of the loop as part of break block removal, and
                    // - BrOnException is inverted to BrOnNoException and a Br is inserted after it.
                    // Otherwise,
                    // - FullJit: BrOnException is removed in the forward pass.
                    case Js::OpCode::BrOnException:
                        Assert(!this->func->DoGlobOpt());
                        break;
                    case Js::OpCode::BrOnNoException:
                        Assert(region->GetType() == RegionTypeTry || region->GetType() == RegionTypeCatch || region->GetType() == RegionTypeFinally ||
                            // A BrOnException from finally to early exit can be converted to BrOnNoException and Br
                            // The Br block maybe a common successor block for early exit along with the BrOnNoException block
                            // Region from Br block will be picked up from a predecessor which is not BrOnNoException due to early exit
                            // See test0() in test/EH/tryfinallytests.js
                            (predRegion->GetType() == RegionTypeFinally && predBlock->GetLastInstr()->AsBranchInstr()->m_brFinallyToEarlyExit));
                        break;
                    case Js::OpCode::Br:
                        if (predBlock->GetLastInstr()->AsBranchInstr()->m_leaveConvToBr)
                        {
                            // Leave converted to Br in finally region
                            AssertMsg(region == predRegion->GetParent(), "Bad region prop in finally");
                        }
                        else if (region->GetType() == RegionTypeCatch && region != predRegion)
                        {
                            AssertMsg(predRegion->GetType() == RegionTypeTry, "Bad region type for the try");
                        }
                        else if (region->GetType() == RegionTypeFinally && region != predRegion)
                        {
                            // We may be left with edges from finally region to early exit
                            AssertMsg(predRegion->IsNonExceptingFinally() || predRegion->GetType() == RegionTypeTry, "Bad region type for the try");
                        }
                        else
                        {
                            // We may be left with edges from finally region to early exit
                            AssertMsg(predRegion->IsNonExceptingFinally() || region == predRegion, "Bad region propagation through interior block");
                        }
                        break;
                    default:
                        break;
                    }
                }
            }
            NEXT_PREDECESSOR_BLOCK;

            switch (region->GetType())
            {
            case RegionTypeRoot:
                Assert(!region->GetMatchingTryRegion() && !region->GetMatchingCatchRegion() && !region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false));
                break;

            case RegionTypeTry:
                if (this->func->DoOptimizeTry() || (this->func->IsSimpleJit() && this->func->hasBailout))
                {
                    Assert((region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && region->GetMatchingFinallyRegion(false)));
                }
                else
                {
                    Assert((region->GetMatchingCatchRegion() != nullptr) ^ (region->GetMatchingFinallyRegion(true) && !region->GetMatchingFinallyRegion(false)));
                }
                break;

            case RegionTypeCatch:
            case RegionTypeFinally:
                Assert(region->GetMatchingTryRegion());
                break;
            }
        }
        NEXT_BLOCK;
    }
#endif
    if (fHasTry)
    {
        FOREACH_BLOCK_ALL(block, this)
        {
            if (block->GetFirstInstr()->IsLabelInstr())
            {
                IR::LabelInstr *labelInstr = block->GetFirstInstr()->AsLabelInstr();
                if (labelInstr->IsUnreferenced())
                {
                    // This is an unreferenced label, probably added by FG building.
                    // Delete it now to make extended basic blocks visible.
                    labelInstr->Remove();
                }
            }
        } NEXT_BLOCK;
    }
    this->func->isFlowGraphValid = false;
}